

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
optimize_problem<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *pvVar1;
  solver_updated_cb *this_00;
  double dVar2;
  int iVar3;
  storage_type sVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  result *prVar8;
  context *pcVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  result_type_conflict *__s;
  result_type_conflict rVar13;
  ulong uVar14;
  int *piVar15;
  raw_result<baryonyx::itm::minimize_tag> *source;
  thread *t;
  pointer ptVar16;
  uint thread_number;
  solution *sol;
  timespec *ptVar17;
  int i;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  atomic_bool stop_task;
  int variables;
  result *local_208;
  context *local_200;
  long loop;
  unsigned_long local_1f0;
  int constraints_remaining;
  double duration;
  double value;
  random_engine rng;
  vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
  functors;
  double cost_constant;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  quadratic_cost_type<float> local_188;
  double *local_168;
  reference_wrapper<const_baryonyx::itm::quadratic_cost_type<float>_> local_160;
  reference_wrapper<const_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  local_158;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
  best_recorder;
  
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar22 = vmovdqu64_avx512f(auVar28);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar22;
  auVar22 = vmovdqu64_avx512f(auVar28);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar22;
  auVar22 = vmovdqu64_avx512f(auVar28);
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar22._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar22._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar22._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar22._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar22._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  if (*(long *)(this + 0x128) != 0) {
    (**(code **)(this + 0x130))(this + 0x118,this);
  }
  make_merged_constraints(&constraints,(context *)this,(problem *)ctx);
  if ((constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar18._0_4_ = (ctx->parameters).seed, lVar18._4_4_ = (ctx->parameters).thread,
     lVar18 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(ctx->parameters).time_limit;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).pushing_iteration_limit);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,
               (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).init_kappa_improve_increase);
    goto LAB_002ca101;
  }
  uVar12 = std::chrono::_V2::system_clock::now();
  if ((ulong)*(uint *)(this + 0xa8) != 0) {
    uVar12 = (ulong)*(uint *)(this + 0xa8);
  }
  rng._M_x = uVar12 % 0x7fffffff + (ulong)(uVar12 % 0x7fffffff == 0);
  variables = (int)((ulong)((ctx->parameters).limit - *(long *)&(ctx->parameters).seed) >> 2) *
              -0x55555555;
  quadratic_cost_type<float>::quadratic_cost_type
            (&local_188,(objective_function *)&(ctx->parameters).delta,variables);
  cost_constant = (ctx->parameters).pushing_objective_amplifier;
  uVar10 = *(uint *)(this + 0xac);
  if ((int)uVar10 < 1) {
    uVar10 = std::thread::hardware_concurrency();
  }
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  thread_number = uVar10 + (uVar10 == 0);
  uVar12 = (ulong)thread_number;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&pool,uVar12,(allocator_type *)&best_recorder);
  local_208 = __return_storage_ptr__;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
  ::best_solution_recorder
            (&best_recorder,&rng,thread_number,&local_188,cost_constant,variables,&constraints,
             *(int *)(this + 0xc4));
  __s = (result_type_conflict *)operator_new__(uVar12 * 8);
  local_200 = (context *)this;
  memset(__s,0,uVar12 * 8);
  loop = 0;
  local_1f0 = 0xffffffffffffffff;
  rVar13 = std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)&loop,&rng,(param_type *)&loop);
  *__s = rVar13;
  if (1 < uVar10) {
    uVar19 = 1;
    do {
      rVar13 = std::uniform_int_distribution<unsigned_long>::operator()
                         ((uniform_int_distribution<unsigned_long> *)&loop,&rng,(param_type *)&loop)
      ;
      __s[uVar19] = rVar13;
      uVar14 = uVar19 - 1;
      if (uVar14 != 0) {
        do {
          iVar11 = (int)uVar14;
          if (__s[uVar14 & 0xffffffff] == __s[uVar19]) {
            rVar13 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&loop,&rng,
                                (param_type *)&loop);
            __s[uVar14 & 0xffffffff] = rVar13;
            iVar11 = (int)uVar19;
          }
          uVar14 = (ulong)(iVar11 - 1U);
        } while (iVar11 - 1U != 0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar12);
  }
  pcVar9 = local_200;
  uVar10 = 0;
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  loop = loop & 0xffffffff00000000;
  do {
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
    ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
              ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>>
                *)&functors,pcVar9,(uint *)&loop,__s + uVar10);
    uVar10 = (int)loop + 1;
    loop = CONCAT44(loop._4_4_,uVar10);
  } while (uVar10 != thread_number);
  lVar18 = 0;
  lVar20 = 0;
  local_168 = &(ctx->parameters).init_kappa_improve_increase;
  do {
    duration = (double)&stop_task;
    _constraints_remaining = &best_recorder;
    local_158._M_data = &constraints;
    value = (double)((long)&(functors.
                             super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ctx + lVar18);
    local_160._M_data = &local_188;
    std::thread::
    thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,float,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::quadratic_cost_type<float>const>,double&,void>
              ((thread *)&loop,
               (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>
                *)&value,(reference_wrapper<std::atomic<bool>_> *)&duration,
               (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>_>
                *)&constraints_remaining,&local_158,&variables,&local_160,&cost_constant);
    if (pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar20]._M_id._M_thread != 0) {
      std::terminate();
    }
    lVar18 = lVar18 + 0xc0;
    pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start[lVar20]._M_id._M_thread = loop;
    lVar20 = lVar20 + 1;
  } while (thread_number != (uint)lVar20);
  lVar18 = std::chrono::_V2::steady_clock::now();
  auVar22 = vpbroadcastq_avx512f();
  auVar22 = vmovdqu64_avx512f(auVar22);
  this_00 = &local_200->update;
  do {
    loop = 1;
    local_1f0 = 0;
    do {
      ptVar17 = (timespec *)&loop;
      iVar11 = nanosleep((timespec *)&loop,(timespec *)&loop);
      if (iVar11 != -1) break;
      piVar15 = __errno_location();
    } while (*piVar15 == 4);
    if ((local_200->update).super__Function_base._M_manager != (_Manager_type)0x0) {
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar23 = vmovdqu64_avx512f(auVar22);
      auVar24 = vpbroadcastq_avx512f(ZEXT816(0xc0));
      auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar29 = ZEXT1664((undefined1  [16])0x0);
      uVar19 = uVar12 + 7 & 0xfffffffffffffff8;
      do {
        vpmullq_avx512dq(auVar28,auVar24);
        uVar14 = vpcmpuq_avx512f(auVar28,auVar23,2);
        auVar26 = vmovdqa64_avx512f(auVar29);
        auVar28 = vpaddq_avx512f(auVar28,auVar25);
        uVar19 = uVar19 - 8;
        auVar29 = vpgatherqq_avx512f(*(undefined8 *)
                                      ((long)&(functors.
                                               super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                              m_call_number + (long)ptVar17));
        auVar27._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * auVar29._8_8_;
        auVar27._0_8_ = (ulong)((byte)uVar14 & 1) * auVar29._0_8_;
        auVar27._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * auVar29._16_8_;
        auVar27._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * auVar29._24_8_;
        auVar27._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * auVar29._32_8_;
        auVar27._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * auVar29._40_8_;
        auVar27._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * auVar29._48_8_;
        auVar27._56_8_ = (uVar14 >> 7) * auVar29._56_8_;
        auVar29 = vpaddq_avx512f(auVar27,auVar26);
      } while (uVar19 != 0);
      auVar28 = vmovdqa64_avx512f(auVar29);
      bVar5 = (bool)((byte)uVar14 & 1);
      auVar23._0_8_ = (ulong)bVar5 * auVar28._0_8_ | (ulong)!bVar5 * auVar26._0_8_;
      bVar5 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar23._8_8_ = (ulong)bVar5 * auVar28._8_8_ | (ulong)!bVar5 * auVar26._8_8_;
      bVar5 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar23._16_8_ = (ulong)bVar5 * auVar28._16_8_ | (ulong)!bVar5 * auVar26._16_8_;
      bVar5 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar23._24_8_ = (ulong)bVar5 * auVar28._24_8_ | (ulong)!bVar5 * auVar26._24_8_;
      bVar5 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar23._32_8_ = (ulong)bVar5 * auVar28._32_8_ | (ulong)!bVar5 * auVar26._32_8_;
      bVar5 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar23._40_8_ = (ulong)bVar5 * auVar28._40_8_ | (ulong)!bVar5 * auVar26._40_8_;
      bVar5 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar23._48_8_ = (ulong)bVar5 * auVar28._48_8_ | (ulong)!bVar5 * auVar26._48_8_;
      auVar23._56_8_ =
           (uVar14 >> 7) * auVar28._56_8_ | (ulong)!SUB81(uVar14 >> 7,0) * auVar26._56_8_;
      auVar21 = vextracti64x4_avx512f(auVar23,1);
      auVar28 = vpaddq_avx512f(auVar23,ZEXT3264(auVar21));
      auVar6 = vpaddq_avx(auVar28._0_16_,auVar28._16_16_);
      auVar7 = vpshufd_avx(auVar6,0xee);
      auVar6 = vpaddq_avx(auVar6,auVar7);
      storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::get_best
                (&best_recorder.m_storage,&constraints_remaining,&value,&duration,&loop);
      std::function<void_(int,_double,_long,_double,_long)>::operator()
                (this_00,constraints_remaining,value,loop,duration,auVar6._0_8_);
    }
    lVar20 = std::chrono::_V2::steady_clock::now();
    pcVar9 = local_200;
    dVar2 = (local_200->parameters).time_limit;
  } while ((dVar2 <= 0.0) || ((double)(lVar20 - lVar18) / 1000000000.0 <= dVar2));
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  prVar8 = local_208;
  for (ptVar16 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; local_208 = prVar8,
      ptVar16 !=
      pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish; ptVar16 = ptVar16 + 1) {
    std::thread::join();
    prVar8 = local_208;
  }
  (prVar8->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(ctx->parameters).time_limit;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(prVar8->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&(prVar8->affected_vars).names,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).pushing_iteration_limit);
  std::vector<signed_char,_std::allocator<signed_char>_>::operator=
            (&(prVar8->affected_vars).values,
             (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&prVar8->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_168);
  prVar8->variables = variables;
  prVar8->constraints =
       (int)((ulong)((long)constraints.
                           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)constraints.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  iVar11 = *best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = best_recorder.m_storage.m_data.
          super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar11].remaining_constraints;
  source = best_recorder.m_storage.m_data.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar11;
  prVar8->status = (uint)(iVar3 != 0) * 3;
  prVar8->duration =
       best_recorder.m_storage.m_data.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar11].duration;
  prVar8->loop = best_recorder.m_storage.m_data.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar11].loop;
  prVar8->remaining_constraints = iVar3;
  sVar4 = (pcVar9->parameters).storage;
  if (sVar4 == one) {
    pvVar1 = &local_208->solutions;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
    sol = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
          _M_impl.super__Vector_impl_data._M_start;
LAB_002c9fc2:
    convert<baryonyx::itm::minimize_tag>(source,sol,variables);
  }
  else {
    if (sVar4 == bound) {
      pvVar1 = &local_208->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
      convert<baryonyx::itm::minimize_tag>
                (source,(pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start,variables);
      source = storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::
               get_worst(&best_recorder.m_storage);
      sol = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
            _M_impl.super__Vector_impl_data._M_start + 1;
      goto LAB_002c9fc2;
    }
    if (sVar4 == five) {
      pvVar1 = &local_208->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
      lVar20 = 0;
      lVar18 = 0;
      do {
        convert<baryonyx::itm::minimize_tag>
                  (best_recorder.m_storage.m_data.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar18],
                   (solution *)
                   ((long)&(((pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start)->variables).
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                   lVar20),variables);
        lVar18 = lVar18 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar18 != 5);
    }
  }
  pcVar9 = local_200;
  storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::show_population
            (&best_recorder.m_storage,local_200);
  if ((pcVar9->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_200->finish)._M_invoker)((_Any_data *)&local_200->finish,local_208);
  }
  operator_delete__(__s);
  if (best_recorder.m_kappa_append.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(best_recorder.m_kappa_append.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)best_recorder.m_kappa_append.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)best_recorder.m_kappa_append.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  __return_storage_ptr__ = local_208;
  if ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
      best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  if ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
      best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  ::~vector(&best_recorder.m_storage.m_data);
  if (best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)best_recorder.m_storage.m_indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)best_recorder.m_storage.m_indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
  if (functors.
      super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(functors.
                    super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)functors.
                          super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)functors.
                          super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((tuple<int_*,_std::default_delete<int[]>_>)
      local_188.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_188.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_188.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((_Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
       )local_188.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
        _M_head_impl != (quad *)0x0) {
    operator_delete__((void *)local_188.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                              ._M_head_impl);
  }
  local_188.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
          )0x0;
  if ((_Head_base<0UL,_float_*,_false>)
      local_188.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_188.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
LAB_002ca101:
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&constraints);
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize_problem(const context& ctx, const problem& pb)
{
    result r;

    if (ctx.start)
        ctx.start(ctx.parameters);

    auto constraints{ make_merged_constraints(ctx, pb) };
    if (constraints.empty() || pb.vars.values.empty()) {
        r.status = result_status::success;
        r.solutions.resize(1);
        r.solutions.back().value = pb.objective.value;
        r.strings = pb.strings;
        r.affected_vars = pb.affected_vars;
        r.variable_name = pb.vars.names;
        return r;
    }

    random_engine rng(init_random_generator_seed(ctx));

    auto variables = length(pb.vars.values);
    auto cost = Cost(pb.objective, variables);
    auto cost_constant = pb.objective.value;

    const auto thread = get_thread_number(ctx);

    std::vector<optimize_functor<Solver, Float, Mode, Cost>> functors;
    std::vector<std::thread> pool(thread);

    best_solution_recorder<Cost, Float, Mode> best_recorder(
      rng,
      thread,
      cost,
      cost_constant,
      variables,
      constraints,
      ctx.parameters.init_population_size);

    auto seeds = generate_seed(rng, thread);

    std::atomic_bool stop_task;
    stop_task.store(false);

    for (unsigned i = 0u; i != thread; ++i)
        functors.emplace_back(ctx, i, seeds[i]);

    for (unsigned i = 0u; i != thread; ++i)
        pool[i] = std::thread(std::ref(functors[i]),
                              std::ref(stop_task),
                              std::ref(best_recorder),
                              std::cref(constraints),
                              variables,
                              std::cref(cost),
                              cost_constant);

    const auto start = std::chrono::steady_clock::now();
    auto end = start;

    do {
        std::this_thread::sleep_for(std::chrono::seconds{ 1L });

        if (ctx.update) {
            auto call_number = 0L;
            for (auto i = 0u; i != thread; ++i)
                call_number += functors[i].m_call_number;

            int constraints_remaining;
            long int loop;
            double value;
            double duration;

            best_recorder.get_best(
              constraints_remaining, value, duration, loop);

            ctx.update(
              constraints_remaining, value, loop, duration, call_number);
        }

        end = std::chrono::steady_clock::now();
    } while (!is_time_limit(ctx.parameters.time_limit, start, end));

    stop_task.store(true);

    for (auto& t : pool)
        t.join();

    r.strings = pb.strings;
    r.affected_vars = pb.affected_vars;
    r.variable_name = pb.vars.names;
    r.variables = variables;
    r.constraints = length(constraints);

    const auto& first = best_recorder.get_best(0);

    if (!first.is_solution())
        r.status = result_status::time_limit_reached;
    else
        r.status = result_status::success;

    r.duration = first.duration;
    r.loop = first.loop;
    r.remaining_constraints = first.remaining_constraints;

    switch (ctx.parameters.storage) {
    case solver_parameters::storage_type::one: {
        r.solutions.resize(1);
        convert(first, r.solutions[0], variables);
    } break;

    case solver_parameters::storage_type::bound: {
        r.solutions.resize(2);

        convert(first, r.solutions[0], variables);
        convert(best_recorder.get_worst(), r.solutions[1], variables);
    } break;

    case solver_parameters::storage_type::five: {
        r.solutions.resize(5);

        for (int i = 0; i != 5; ++i)
            convert(best_recorder.get_best(i), r.solutions[i], variables);
    } break;
    }

    best_recorder.show_population(ctx);

    if (ctx.finish)
        ctx.finish(r);

    return r;
}